

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_lax_polygon_layer.cc
# Opt level: O1

void __thiscall
s2builderutil::LaxPolygonLayer::Init
          (LaxPolygonLayer *this,S2LaxPolygonShape *polygon,LabelSetIds *label_set_ids,
          IdSetLexicon *label_set_lexicon,Options *options)

{
  S2LogMessage SStack_18;
  
  if ((label_set_ids == (LabelSetIds *)0x0) == (label_set_lexicon == (IdSetLexicon *)0x0)) {
    this->polygon_ = polygon;
    this->label_set_ids_ = label_set_ids;
    this->label_set_lexicon_ = label_set_lexicon;
    this->options_ = *options;
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_lax_polygon_layer.cc"
             ,0x3c,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,
             "Check failed: (label_set_ids == nullptr) == (label_set_lexicon == nullptr) ",0x4b);
  abort();
}

Assistant:

void LaxPolygonLayer::Init(
    S2LaxPolygonShape* polygon, LabelSetIds* label_set_ids,
    IdSetLexicon* label_set_lexicon, const Options& options) {
  S2_DCHECK_EQ(label_set_ids == nullptr, label_set_lexicon == nullptr);
  polygon_ = polygon;
  label_set_ids_ = label_set_ids;
  label_set_lexicon_ = label_set_lexicon;
  options_ = options;
}